

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_go.cpp
# Opt level: O3

void __thiscall
flatbuffers::go::GoGenerator::GenNativeTablePack
          (GoGenerator *this,StructDef *struct_def,string *code_ptr)

{
  IdlNamer *pIVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  BaseType BVar3;
  FieldDef *pFVar4;
  EnumDef *pEVar5;
  pointer pcVar6;
  long *plVar7;
  undefined8 *puVar8;
  pointer ppFVar9;
  size_type *psVar10;
  ulong *puVar11;
  pointer ppFVar12;
  undefined8 uVar13;
  ulong uVar14;
  _Alloc_hider _Var15;
  string length;
  string offsets;
  string field_var;
  string field_field;
  string offset;
  string struct_type;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_250;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_230;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_210;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f0;
  string *local_1d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  ulong *local_1a8;
  long local_1a0;
  ulong local_198;
  long lStack_190;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_188;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_168;
  ulong *local_148;
  long local_140;
  ulong local_138;
  long lStack_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  string local_108;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  StructDef *local_c8;
  GoGenerator *local_c0;
  IdlNamer *local_b8;
  string local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  Type local_50;
  
  pIVar1 = &this->namer_;
  local_1d0 = code_ptr;
  (*(this->namer_).super_Namer._vptr_Namer[0xf])(&local_90,pIVar1,struct_def);
  local_c8 = struct_def;
  local_c0 = this;
  (*(this->namer_).super_Namer._vptr_Namer[0x11])(&local_e8,pIVar1,struct_def);
  plVar7 = (long *)std::__cxx11::string::replace((ulong)&local_e8,0,(char *)0x0,0x36ba03);
  psVar10 = (size_type *)(plVar7 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar7 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar10) {
    local_1c8.field_2._M_allocated_capacity = *psVar10;
    local_1c8.field_2._8_8_ = plVar7[3];
    local_1c8._M_dataplus._M_p = (pointer)&local_1c8.field_2;
  }
  else {
    local_1c8.field_2._M_allocated_capacity = *psVar10;
    local_1c8._M_dataplus._M_p = (pointer)*plVar7;
  }
  local_1c8._M_string_length = plVar7[1];
  *plVar7 = (long)psVar10;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_1c8);
  psVar10 = (size_type *)(plVar7 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar7 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar10) {
    local_168.field_2._M_allocated_capacity = *psVar10;
    local_168.field_2._8_8_ = plVar7[3];
    local_168._M_dataplus._M_p = (pointer)&local_168.field_2;
  }
  else {
    local_168.field_2._M_allocated_capacity = *psVar10;
    local_168._M_dataplus._M_p = (pointer)*plVar7;
  }
  local_168._M_string_length = plVar7[1];
  *plVar7 = (long)psVar10;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  std::__cxx11::string::_M_append((char *)local_1d0,(ulong)local_168._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_168._M_dataplus._M_p != &local_168.field_2) {
    operator_delete(local_168._M_dataplus._M_p,local_168.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
    operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
    operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::string::append((char *)local_1d0);
  ppFVar12 = (local_c8->fields).vec.
             super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>.
             _M_impl.super__Vector_impl_data._M_start;
  if (ppFVar12 !=
      (local_c8->fields).vec.
      super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    do {
      pFVar4 = *ppFVar12;
      if ((pFVar4->deprecated == false) && (0xb < (pFVar4->value).type.base_type - BASE_TYPE_UTYPE))
      {
        (*(pIVar1->super_Namer)._vptr_Namer[0x12])(&local_168,pIVar1,pFVar4);
        (*(pIVar1->super_Namer)._vptr_Namer[7])(&local_1c8,pIVar1,pFVar4);
        local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_e8,local_1c8._M_dataplus._M_p,
                   local_1c8._M_dataplus._M_p + local_1c8._M_string_length);
        std::__cxx11::string::append((char *)&local_e8);
        switch((pFVar4->value).type.base_type) {
        case BASE_TYPE_STRING:
          std::operator+(&local_1f0,"\t",&local_e8);
          plVar7 = (long *)std::__cxx11::string::append((char *)&local_1f0);
          local_210._M_dataplus._M_p = (pointer)&local_210.field_2;
          psVar10 = (size_type *)(plVar7 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar7 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar10) {
            local_210.field_2._M_allocated_capacity = *psVar10;
            local_210.field_2._8_8_ = plVar7[3];
          }
          else {
            local_210.field_2._M_allocated_capacity = *psVar10;
            local_210._M_dataplus._M_p = (pointer)*plVar7;
          }
          local_210._M_string_length = plVar7[1];
          *plVar7 = (long)psVar10;
          plVar7[1] = 0;
          *(undefined1 *)(plVar7 + 2) = 0;
          std::__cxx11::string::_M_append((char *)local_1d0,(ulong)local_210._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_210._M_dataplus._M_p != &local_210.field_2) {
            operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
            operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1);
          }
          std::operator+(&local_1f0,"\tif t.",&local_168);
          plVar7 = (long *)std::__cxx11::string::append((char *)&local_1f0);
          local_210._M_dataplus._M_p = (pointer)&local_210.field_2;
          psVar10 = (size_type *)(plVar7 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar7 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar10) {
            local_210.field_2._M_allocated_capacity = *psVar10;
            local_210.field_2._8_8_ = plVar7[3];
          }
          else {
            local_210.field_2._M_allocated_capacity = *psVar10;
            local_210._M_dataplus._M_p = (pointer)*plVar7;
          }
          local_210._M_string_length = plVar7[1];
          *plVar7 = (long)psVar10;
          plVar7[1] = 0;
          *(undefined1 *)(plVar7 + 2) = 0;
          std::__cxx11::string::_M_append((char *)local_1d0,(ulong)local_210._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_210._M_dataplus._M_p != &local_210.field_2) {
            operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
            operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1);
          }
          std::operator+(&local_230,"\t\t",&local_e8);
          puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_230);
          local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
          psVar10 = puVar8 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar8 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar10) {
            local_250.field_2._M_allocated_capacity = *psVar10;
            local_250.field_2._8_8_ = puVar8[3];
          }
          else {
            local_250.field_2._M_allocated_capacity = *psVar10;
            local_250._M_dataplus._M_p = (pointer)*puVar8;
          }
          local_250._M_string_length = puVar8[1];
          *puVar8 = psVar10;
          puVar8[1] = 0;
          *(undefined1 *)(puVar8 + 2) = 0;
          puVar8 = (undefined8 *)
                   std::__cxx11::string::_M_append
                             ((char *)&local_250,(ulong)local_168._M_dataplus._M_p);
          local_1f0._M_dataplus._M_p = (pointer)&local_1f0.field_2;
          psVar10 = puVar8 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar8 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar10) {
            local_1f0.field_2._M_allocated_capacity = *psVar10;
            local_1f0.field_2._8_8_ = puVar8[3];
          }
          else {
            local_1f0.field_2._M_allocated_capacity = *psVar10;
            local_1f0._M_dataplus._M_p = (pointer)*puVar8;
          }
          local_1f0._M_string_length = puVar8[1];
          *puVar8 = psVar10;
          puVar8[1] = 0;
          *(undefined1 *)(puVar8 + 2) = 0;
          puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_1f0);
          local_210._M_dataplus._M_p = (pointer)&local_210.field_2;
          puVar11 = puVar8 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar8 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)puVar11) {
            local_210.field_2._M_allocated_capacity = *puVar11;
            local_210.field_2._8_8_ = puVar8[3];
          }
          else {
            local_210.field_2._M_allocated_capacity = *puVar11;
            local_210._M_dataplus._M_p = (pointer)*puVar8;
          }
          local_210._M_string_length = puVar8[1];
          *puVar8 = puVar11;
          puVar8[1] = 0;
          *(undefined1 *)(puVar8 + 2) = 0;
          std::__cxx11::string::_M_append((char *)local_1d0,(ulong)local_210._M_dataplus._M_p);
LAB_00204225:
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_210._M_dataplus._M_p != &local_210.field_2) {
            operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
            operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_250._M_dataplus._M_p != &local_250.field_2) {
            operator_delete(local_250._M_dataplus._M_p,local_250.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_230._M_dataplus._M_p != &local_230.field_2) {
            operator_delete(local_230._M_dataplus._M_p,local_230.field_2._M_allocated_capacity + 1);
          }
          std::__cxx11::string::append((char *)local_1d0);
          break;
        case BASE_TYPE_VECTOR:
        case BASE_TYPE_VECTOR64:
          if (((pFVar4->value).type.element == BASE_TYPE_UCHAR) &&
             ((pFVar4->value).type.enum_def == (EnumDef *)0x0)) {
            std::operator+(&local_1f0,"\t",&local_e8);
            plVar7 = (long *)std::__cxx11::string::append((char *)&local_1f0);
            local_210._M_dataplus._M_p = (pointer)&local_210.field_2;
            psVar10 = (size_type *)(plVar7 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar7 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar10) {
              local_210.field_2._M_allocated_capacity = *psVar10;
              local_210.field_2._8_8_ = plVar7[3];
            }
            else {
              local_210.field_2._M_allocated_capacity = *psVar10;
              local_210._M_dataplus._M_p = (pointer)*plVar7;
            }
            local_210._M_string_length = plVar7[1];
            *plVar7 = (long)psVar10;
            plVar7[1] = 0;
            *(undefined1 *)(plVar7 + 2) = 0;
            std::__cxx11::string::_M_append((char *)local_1d0,(ulong)local_210._M_dataplus._M_p);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_210._M_dataplus._M_p != &local_210.field_2) {
              operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
              operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1
                             );
            }
            std::operator+(&local_1f0,"\tif t.",&local_168);
            plVar7 = (long *)std::__cxx11::string::append((char *)&local_1f0);
            local_210._M_dataplus._M_p = (pointer)&local_210.field_2;
            psVar10 = (size_type *)(plVar7 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar7 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar10) {
              local_210.field_2._M_allocated_capacity = *psVar10;
              local_210.field_2._8_8_ = plVar7[3];
            }
            else {
              local_210.field_2._M_allocated_capacity = *psVar10;
              local_210._M_dataplus._M_p = (pointer)*plVar7;
            }
            local_210._M_string_length = plVar7[1];
            *plVar7 = (long)psVar10;
            plVar7[1] = 0;
            *(undefined1 *)(plVar7 + 2) = 0;
            std::__cxx11::string::_M_append((char *)local_1d0,(ulong)local_210._M_dataplus._M_p);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_210._M_dataplus._M_p != &local_210.field_2) {
              operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
              operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1
                             );
            }
            std::operator+(&local_230,"\t\t",&local_e8);
            puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_230);
            local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
            psVar10 = puVar8 + 2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar8 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar10) {
              local_250.field_2._M_allocated_capacity = *psVar10;
              local_250.field_2._8_8_ = puVar8[3];
            }
            else {
              local_250.field_2._M_allocated_capacity = *psVar10;
              local_250._M_dataplus._M_p = (pointer)*puVar8;
            }
            local_250._M_string_length = puVar8[1];
            *puVar8 = psVar10;
            puVar8[1] = 0;
            *(undefined1 *)(puVar8 + 2) = 0;
            puVar8 = (undefined8 *)
                     std::__cxx11::string::_M_append
                               ((char *)&local_250,(ulong)local_168._M_dataplus._M_p);
            local_1f0._M_dataplus._M_p = (pointer)&local_1f0.field_2;
            psVar10 = puVar8 + 2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar8 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar10) {
              local_1f0.field_2._M_allocated_capacity = *psVar10;
              local_1f0.field_2._8_8_ = puVar8[3];
            }
            else {
              local_1f0.field_2._M_allocated_capacity = *psVar10;
              local_1f0._M_dataplus._M_p = (pointer)*puVar8;
            }
            local_1f0._M_string_length = puVar8[1];
            *puVar8 = psVar10;
            puVar8[1] = 0;
            *(undefined1 *)(puVar8 + 2) = 0;
            puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_1f0);
            local_210._M_dataplus._M_p = (pointer)&local_210.field_2;
            puVar11 = puVar8 + 2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar8 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)puVar11) {
              local_210.field_2._M_allocated_capacity = *puVar11;
              local_210.field_2._8_8_ = puVar8[3];
            }
            else {
              local_210.field_2._M_allocated_capacity = *puVar11;
              local_210._M_dataplus._M_p = (pointer)*puVar8;
            }
            local_210._M_string_length = puVar8[1];
            *puVar8 = puVar11;
            puVar8[1] = 0;
            *(undefined1 *)(puVar8 + 2) = 0;
            std::__cxx11::string::_M_append((char *)local_1d0,(ulong)local_210._M_dataplus._M_p);
            goto LAB_00204225;
          }
          std::operator+(&local_1f0,"\t",&local_e8);
          plVar7 = (long *)std::__cxx11::string::append((char *)&local_1f0);
          local_210._M_dataplus._M_p = (pointer)&local_210.field_2;
          psVar10 = (size_type *)(plVar7 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar7 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar10) {
            local_210.field_2._M_allocated_capacity = *psVar10;
            local_210.field_2._8_8_ = plVar7[3];
          }
          else {
            local_210.field_2._M_allocated_capacity = *psVar10;
            local_210._M_dataplus._M_p = (pointer)*plVar7;
          }
          local_210._M_string_length = plVar7[1];
          *plVar7 = (long)psVar10;
          plVar7[1] = 0;
          *(undefined1 *)(plVar7 + 2) = 0;
          std::__cxx11::string::_M_append((char *)local_1d0,(ulong)local_210._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_210._M_dataplus._M_p != &local_210.field_2) {
            operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
            operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1);
          }
          std::operator+(&local_1f0,"\tif t.",&local_168);
          plVar7 = (long *)std::__cxx11::string::append((char *)&local_1f0);
          local_210._M_dataplus._M_p = (pointer)&local_210.field_2;
          puVar11 = (ulong *)(plVar7 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar7 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)puVar11) {
            local_210.field_2._M_allocated_capacity = *puVar11;
            local_210.field_2._8_8_ = plVar7[3];
          }
          else {
            local_210.field_2._M_allocated_capacity = *puVar11;
            local_210._M_dataplus._M_p = (pointer)*plVar7;
          }
          local_210._M_string_length = plVar7[1];
          *plVar7 = (long)puVar11;
          plVar7[1] = 0;
          *(undefined1 *)(plVar7 + 2) = 0;
          std::__cxx11::string::_M_append((char *)local_1d0,(ulong)local_210._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_210._M_dataplus._M_p != &local_210.field_2) {
            operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
            operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1);
          }
          local_210._M_dataplus._M_p = (pointer)&local_210.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_210,local_1c8._M_dataplus._M_p,
                     local_1c8._M_dataplus._M_p + local_1c8._M_string_length);
          std::__cxx11::string::append((char *)&local_210);
          local_1f0._M_dataplus._M_p = (pointer)&local_1f0.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_1f0,local_1c8._M_dataplus._M_p,
                     local_1c8._M_dataplus._M_p + local_1c8._M_string_length);
          std::__cxx11::string::append((char *)&local_1f0);
          std::operator+(&local_188,"\t\t",&local_210);
          plVar7 = (long *)std::__cxx11::string::append((char *)&local_188);
          local_1a8 = &local_198;
          puVar11 = (ulong *)(plVar7 + 2);
          if ((ulong *)*plVar7 == puVar11) {
            local_198 = *puVar11;
            lStack_190 = plVar7[3];
          }
          else {
            local_198 = *puVar11;
            local_1a8 = (ulong *)*plVar7;
          }
          local_1a0 = plVar7[1];
          *plVar7 = (long)puVar11;
          plVar7[1] = 0;
          *(undefined1 *)(plVar7 + 2) = 0;
          plVar7 = (long *)std::__cxx11::string::_M_append
                                     ((char *)&local_1a8,(ulong)local_168._M_dataplus._M_p);
          local_230._M_dataplus._M_p = (pointer)&local_230.field_2;
          psVar10 = (size_type *)(plVar7 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar7 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar10) {
            local_230.field_2._M_allocated_capacity = *psVar10;
            local_230.field_2._8_8_ = plVar7[3];
          }
          else {
            local_230.field_2._M_allocated_capacity = *psVar10;
            local_230._M_dataplus._M_p = (pointer)*plVar7;
          }
          local_230._M_string_length = plVar7[1];
          *plVar7 = (long)psVar10;
          plVar7[1] = 0;
          *(undefined1 *)(plVar7 + 2) = 0;
          plVar7 = (long *)std::__cxx11::string::append((char *)&local_230);
          local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
          psVar10 = (size_type *)(plVar7 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar7 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar10) {
            local_250.field_2._M_allocated_capacity = *psVar10;
            local_250.field_2._8_8_ = plVar7[3];
          }
          else {
            local_250.field_2._M_allocated_capacity = *psVar10;
            local_250._M_dataplus._M_p = (pointer)*plVar7;
          }
          local_250._M_string_length = plVar7[1];
          *plVar7 = (long)psVar10;
          plVar7[1] = 0;
          *(undefined1 *)(plVar7 + 2) = 0;
          std::__cxx11::string::_M_append((char *)local_1d0,(ulong)local_250._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_250._M_dataplus._M_p != &local_250.field_2) {
            operator_delete(local_250._M_dataplus._M_p,local_250.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_230._M_dataplus._M_p != &local_230.field_2) {
            operator_delete(local_230._M_dataplus._M_p,local_230.field_2._M_allocated_capacity + 1);
          }
          if (local_1a8 != &local_198) {
            operator_delete(local_1a8,local_198 + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_188._M_dataplus._M_p != &local_188.field_2) {
            operator_delete(local_188._M_dataplus._M_p,local_188.field_2._M_allocated_capacity + 1);
          }
          BVar3 = (pFVar4->value).type.element;
          if (BVar3 == BASE_TYPE_STRUCT) {
            if (((pFVar4->value).type.struct_def)->fixed == false) {
              std::operator+(&local_188,"\t\t",&local_1f0);
              plVar7 = (long *)std::__cxx11::string::append((char *)&local_188);
              local_1a8 = &local_198;
              puVar11 = (ulong *)(plVar7 + 2);
              if ((ulong *)*plVar7 == puVar11) {
                local_198 = *puVar11;
                lStack_190 = plVar7[3];
              }
              else {
                local_198 = *puVar11;
                local_1a8 = (ulong *)*plVar7;
              }
              local_1a0 = plVar7[1];
              *plVar7 = (long)puVar11;
              plVar7[1] = 0;
              *(undefined1 *)(plVar7 + 2) = 0;
              plVar7 = (long *)std::__cxx11::string::_M_append
                                         ((char *)&local_1a8,(ulong)local_210._M_dataplus._M_p);
              local_230._M_dataplus._M_p = (pointer)&local_230.field_2;
              psVar10 = (size_type *)(plVar7 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar7 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)psVar10) {
                local_230.field_2._M_allocated_capacity = *psVar10;
                local_230.field_2._8_8_ = plVar7[3];
              }
              else {
                local_230.field_2._M_allocated_capacity = *psVar10;
                local_230._M_dataplus._M_p = (pointer)*plVar7;
              }
              local_230._M_string_length = plVar7[1];
              *plVar7 = (long)psVar10;
              plVar7[1] = 0;
              *(undefined1 *)(plVar7 + 2) = 0;
              plVar7 = (long *)std::__cxx11::string::append((char *)&local_230);
              local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
              psVar10 = (size_type *)(plVar7 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar7 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)psVar10) {
                local_250.field_2._M_allocated_capacity = *psVar10;
                local_250.field_2._8_8_ = plVar7[3];
              }
              else {
                local_250.field_2._M_allocated_capacity = *psVar10;
                local_250._M_dataplus._M_p = (pointer)*plVar7;
              }
              local_250._M_string_length = plVar7[1];
              *plVar7 = (long)psVar10;
              plVar7[1] = 0;
              *(undefined1 *)(plVar7 + 2) = 0;
              std::__cxx11::string::_M_append((char *)local_1d0,(ulong)local_250._M_dataplus._M_p);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_250._M_dataplus._M_p != &local_250.field_2) {
                operator_delete(local_250._M_dataplus._M_p,
                                local_250.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_230._M_dataplus._M_p != &local_230.field_2) {
                operator_delete(local_230._M_dataplus._M_p,
                                local_230.field_2._M_allocated_capacity + 1);
              }
              if (local_1a8 != &local_198) {
                operator_delete(local_1a8,local_198 + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_188._M_dataplus._M_p != &local_188.field_2) {
                operator_delete(local_188._M_dataplus._M_p,
                                local_188.field_2._M_allocated_capacity + 1);
              }
              std::operator+(&local_230,"\t\tfor j := 0; j < ",&local_210);
              plVar7 = (long *)std::__cxx11::string::append((char *)&local_230);
              local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
              psVar10 = (size_type *)(plVar7 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar7 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)psVar10) {
                local_250.field_2._M_allocated_capacity = *psVar10;
                local_250.field_2._8_8_ = plVar7[3];
              }
              else {
                local_250.field_2._M_allocated_capacity = *psVar10;
                local_250._M_dataplus._M_p = (pointer)*plVar7;
              }
              local_250._M_string_length = plVar7[1];
              *plVar7 = (long)psVar10;
              plVar7[1] = 0;
              *(undefined1 *)(plVar7 + 2) = 0;
              std::__cxx11::string::_M_append((char *)local_1d0,(ulong)local_250._M_dataplus._M_p);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_250._M_dataplus._M_p != &local_250.field_2) {
                operator_delete(local_250._M_dataplus._M_p,
                                local_250.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_230._M_dataplus._M_p != &local_230.field_2) {
                operator_delete(local_230._M_dataplus._M_p,
                                local_230.field_2._M_allocated_capacity + 1);
              }
              std::operator+(&local_188,"\t\t\t",&local_1f0);
              puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_188);
              local_1a8 = &local_198;
              puVar11 = puVar8 + 2;
              if ((ulong *)*puVar8 == puVar11) {
                local_198 = *puVar11;
                lStack_190 = puVar8[3];
              }
              else {
                local_198 = *puVar11;
                local_1a8 = (ulong *)*puVar8;
              }
              local_1a0 = puVar8[1];
              *puVar8 = puVar11;
              puVar8[1] = 0;
              *(undefined1 *)(puVar8 + 2) = 0;
              puVar8 = (undefined8 *)
                       std::__cxx11::string::_M_append
                                 ((char *)&local_1a8,(ulong)local_168._M_dataplus._M_p);
              local_230._M_dataplus._M_p = (pointer)&local_230.field_2;
              psVar10 = puVar8 + 2;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*puVar8 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)psVar10) {
                local_230.field_2._M_allocated_capacity = *psVar10;
                local_230.field_2._8_8_ = puVar8[3];
              }
              else {
                local_230.field_2._M_allocated_capacity = *psVar10;
                local_230._M_dataplus._M_p = (pointer)*puVar8;
              }
              local_230._M_string_length = puVar8[1];
              *puVar8 = psVar10;
              puVar8[1] = 0;
              *(undefined1 *)(puVar8 + 2) = 0;
              plVar7 = (long *)std::__cxx11::string::append((char *)&local_230);
              local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
              psVar10 = (size_type *)(plVar7 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar7 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)psVar10) {
                local_250.field_2._M_allocated_capacity = *psVar10;
                local_250.field_2._8_8_ = plVar7[3];
              }
              else {
                local_250.field_2._M_allocated_capacity = *psVar10;
                local_250._M_dataplus._M_p = (pointer)*plVar7;
              }
              local_250._M_string_length = plVar7[1];
              *plVar7 = (long)psVar10;
              plVar7[1] = 0;
              *(undefined1 *)(plVar7 + 2) = 0;
              std::__cxx11::string::_M_append((char *)local_1d0,(ulong)local_250._M_dataplus._M_p);
              goto LAB_0020462a;
            }
          }
          else if (BVar3 == BASE_TYPE_STRING) {
            std::operator+(&local_188,"\t\t",&local_1f0);
            plVar7 = (long *)std::__cxx11::string::append((char *)&local_188);
            local_1a8 = &local_198;
            puVar11 = (ulong *)(plVar7 + 2);
            if ((ulong *)*plVar7 == puVar11) {
              local_198 = *puVar11;
              lStack_190 = plVar7[3];
            }
            else {
              local_198 = *puVar11;
              local_1a8 = (ulong *)*plVar7;
            }
            local_1a0 = plVar7[1];
            *plVar7 = (long)puVar11;
            plVar7[1] = 0;
            *(undefined1 *)(plVar7 + 2) = 0;
            plVar7 = (long *)std::__cxx11::string::_M_append
                                       ((char *)&local_1a8,(ulong)local_210._M_dataplus._M_p);
            local_230._M_dataplus._M_p = (pointer)&local_230.field_2;
            psVar10 = (size_type *)(plVar7 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar7 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar10) {
              local_230.field_2._M_allocated_capacity = *psVar10;
              local_230.field_2._8_8_ = plVar7[3];
            }
            else {
              local_230.field_2._M_allocated_capacity = *psVar10;
              local_230._M_dataplus._M_p = (pointer)*plVar7;
            }
            local_230._M_string_length = plVar7[1];
            *plVar7 = (long)psVar10;
            plVar7[1] = 0;
            *(undefined1 *)(plVar7 + 2) = 0;
            plVar7 = (long *)std::__cxx11::string::append((char *)&local_230);
            local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
            psVar10 = (size_type *)(plVar7 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar7 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar10) {
              local_250.field_2._M_allocated_capacity = *psVar10;
              local_250.field_2._8_8_ = plVar7[3];
            }
            else {
              local_250.field_2._M_allocated_capacity = *psVar10;
              local_250._M_dataplus._M_p = (pointer)*plVar7;
            }
            local_250._M_string_length = plVar7[1];
            *plVar7 = (long)psVar10;
            plVar7[1] = 0;
            *(undefined1 *)(plVar7 + 2) = 0;
            std::__cxx11::string::_M_append((char *)local_1d0,(ulong)local_250._M_dataplus._M_p);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_250._M_dataplus._M_p != &local_250.field_2) {
              operator_delete(local_250._M_dataplus._M_p,local_250.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_230._M_dataplus._M_p != &local_230.field_2) {
              operator_delete(local_230._M_dataplus._M_p,local_230.field_2._M_allocated_capacity + 1
                             );
            }
            if (local_1a8 != &local_198) {
              operator_delete(local_1a8,local_198 + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_188._M_dataplus._M_p != &local_188.field_2) {
              operator_delete(local_188._M_dataplus._M_p,local_188.field_2._M_allocated_capacity + 1
                             );
            }
            std::operator+(&local_230,"\t\tfor j := 0; j < ",&local_210);
            plVar7 = (long *)std::__cxx11::string::append((char *)&local_230);
            local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
            psVar10 = (size_type *)(plVar7 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar7 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar10) {
              local_250.field_2._M_allocated_capacity = *psVar10;
              local_250.field_2._8_8_ = plVar7[3];
            }
            else {
              local_250.field_2._M_allocated_capacity = *psVar10;
              local_250._M_dataplus._M_p = (pointer)*plVar7;
            }
            local_250._M_string_length = plVar7[1];
            *plVar7 = (long)psVar10;
            plVar7[1] = 0;
            *(undefined1 *)(plVar7 + 2) = 0;
            std::__cxx11::string::_M_append((char *)local_1d0,(ulong)local_250._M_dataplus._M_p);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_250._M_dataplus._M_p != &local_250.field_2) {
              operator_delete(local_250._M_dataplus._M_p,local_250.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_230._M_dataplus._M_p != &local_230.field_2) {
              operator_delete(local_230._M_dataplus._M_p,local_230.field_2._M_allocated_capacity + 1
                             );
            }
            std::operator+(&local_188,"\t\t\t",&local_1f0);
            plVar7 = (long *)std::__cxx11::string::append((char *)&local_188);
            local_1a8 = &local_198;
            puVar11 = (ulong *)(plVar7 + 2);
            if ((ulong *)*plVar7 == puVar11) {
              local_198 = *puVar11;
              lStack_190 = plVar7[3];
            }
            else {
              local_198 = *puVar11;
              local_1a8 = (ulong *)*plVar7;
            }
            local_1a0 = plVar7[1];
            *plVar7 = (long)puVar11;
            plVar7[1] = 0;
            *(undefined1 *)(plVar7 + 2) = 0;
            plVar7 = (long *)std::__cxx11::string::_M_append
                                       ((char *)&local_1a8,(ulong)local_168._M_dataplus._M_p);
            local_230._M_dataplus._M_p = (pointer)&local_230.field_2;
            psVar10 = (size_type *)(plVar7 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar7 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar10) {
              local_230.field_2._M_allocated_capacity = *psVar10;
              local_230.field_2._8_8_ = plVar7[3];
            }
            else {
              local_230.field_2._M_allocated_capacity = *psVar10;
              local_230._M_dataplus._M_p = (pointer)*plVar7;
            }
            local_230._M_string_length = plVar7[1];
            *plVar7 = (long)psVar10;
            plVar7[1] = 0;
            *(undefined1 *)(plVar7 + 2) = 0;
            plVar7 = (long *)std::__cxx11::string::append((char *)&local_230);
            local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
            psVar10 = (size_type *)(plVar7 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar7 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar10) {
              local_250.field_2._M_allocated_capacity = *psVar10;
              local_250.field_2._8_8_ = plVar7[3];
            }
            else {
              local_250.field_2._M_allocated_capacity = *psVar10;
              local_250._M_dataplus._M_p = (pointer)*plVar7;
            }
            local_250._M_string_length = plVar7[1];
            *plVar7 = (long)psVar10;
            plVar7[1] = 0;
            *(undefined1 *)(plVar7 + 2) = 0;
            std::__cxx11::string::_M_append((char *)local_1d0,(ulong)local_250._M_dataplus._M_p);
LAB_0020462a:
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_250._M_dataplus._M_p != &local_250.field_2) {
              operator_delete(local_250._M_dataplus._M_p,local_250.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_230._M_dataplus._M_p != &local_230.field_2) {
              operator_delete(local_230._M_dataplus._M_p,local_230.field_2._M_allocated_capacity + 1
                             );
            }
            if (local_1a8 != &local_198) {
              operator_delete(local_1a8,local_198 + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_188._M_dataplus._M_p != &local_188.field_2) {
              operator_delete(local_188._M_dataplus._M_p,local_188.field_2._M_allocated_capacity + 1
                             );
            }
            std::__cxx11::string::append((char *)local_1d0);
          }
          std::operator+(&local_128,"\t\t",&local_90);
          plVar7 = (long *)std::__cxx11::string::append((char *)&local_128);
          local_148 = &local_138;
          puVar11 = (ulong *)(plVar7 + 2);
          if ((ulong *)*plVar7 == puVar11) {
            local_138 = *puVar11;
            lStack_130 = plVar7[3];
          }
          else {
            local_138 = *puVar11;
            local_148 = (ulong *)*plVar7;
          }
          local_140 = plVar7[1];
          *plVar7 = (long)puVar11;
          plVar7[1] = 0;
          *(undefined1 *)(plVar7 + 2) = 0;
          (*(pIVar1->super_Namer)._vptr_Namer[6])(&local_108,pIVar1,pFVar4);
          uVar14 = 0xf;
          if (local_148 != &local_138) {
            uVar14 = local_138;
          }
          if (uVar14 < local_108._M_string_length + local_140) {
            uVar13 = 0xf;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_108._M_dataplus._M_p != &local_108.field_2) {
              uVar13 = local_108.field_2._M_allocated_capacity;
            }
            if ((ulong)uVar13 < local_108._M_string_length + local_140) goto LAB_002047ba;
            puVar8 = (undefined8 *)
                     std::__cxx11::string::replace((ulong)&local_108,0,(char *)0x0,(ulong)local_148)
            ;
          }
          else {
LAB_002047ba:
            puVar8 = (undefined8 *)
                     std::__cxx11::string::_M_append
                               ((char *)&local_148,(ulong)local_108._M_dataplus._M_p);
          }
          local_188._M_dataplus._M_p = (pointer)&local_188.field_2;
          puVar11 = puVar8 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar8 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)puVar11) {
            local_188.field_2._M_allocated_capacity = *puVar11;
            local_188.field_2._8_8_ = puVar8[3];
          }
          else {
            local_188.field_2._M_allocated_capacity = *puVar11;
            local_188._M_dataplus._M_p = (pointer)*puVar8;
          }
          local_188._M_string_length = puVar8[1];
          *puVar8 = puVar11;
          puVar8[1] = 0;
          *(undefined1 *)puVar11 = 0;
          plVar7 = (long *)std::__cxx11::string::append((char *)&local_188);
          local_1a8 = &local_198;
          puVar11 = (ulong *)(plVar7 + 2);
          if ((ulong *)*plVar7 == puVar11) {
            local_198 = *puVar11;
            lStack_190 = plVar7[3];
          }
          else {
            local_198 = *puVar11;
            local_1a8 = (ulong *)*plVar7;
          }
          local_1a0 = plVar7[1];
          *plVar7 = (long)puVar11;
          plVar7[1] = 0;
          *(undefined1 *)(plVar7 + 2) = 0;
          puVar8 = (undefined8 *)
                   std::__cxx11::string::_M_append
                             ((char *)&local_1a8,(ulong)local_210._M_dataplus._M_p);
          local_230._M_dataplus._M_p = (pointer)&local_230.field_2;
          psVar10 = puVar8 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar8 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar10) {
            local_230.field_2._M_allocated_capacity = *psVar10;
            local_230.field_2._8_8_ = puVar8[3];
          }
          else {
            local_230.field_2._M_allocated_capacity = *psVar10;
            local_230._M_dataplus._M_p = (pointer)*puVar8;
          }
          local_230._M_string_length = puVar8[1];
          *puVar8 = psVar10;
          puVar8[1] = 0;
          *(undefined1 *)(puVar8 + 2) = 0;
          plVar7 = (long *)std::__cxx11::string::append((char *)&local_230);
          local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
          psVar10 = (size_type *)(plVar7 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar7 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar10) {
            local_250.field_2._M_allocated_capacity = *psVar10;
            local_250.field_2._8_8_ = plVar7[3];
          }
          else {
            local_250.field_2._M_allocated_capacity = *psVar10;
            local_250._M_dataplus._M_p = (pointer)*plVar7;
          }
          local_250._M_string_length = plVar7[1];
          *plVar7 = (long)psVar10;
          plVar7[1] = 0;
          *(undefined1 *)(plVar7 + 2) = 0;
          std::__cxx11::string::_M_append((char *)local_1d0,(ulong)local_250._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_250._M_dataplus._M_p != &local_250.field_2) {
            operator_delete(local_250._M_dataplus._M_p,local_250.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_230._M_dataplus._M_p != &local_230.field_2) {
            operator_delete(local_230._M_dataplus._M_p,local_230.field_2._M_allocated_capacity + 1);
          }
          if (local_1a8 != &local_198) {
            operator_delete(local_1a8,local_198 + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_188._M_dataplus._M_p != &local_188.field_2) {
            operator_delete(local_188._M_dataplus._M_p,local_188.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_108._M_dataplus._M_p != &local_108.field_2) {
            operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
          }
          if (local_148 != &local_138) {
            operator_delete(local_148,local_138 + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_128._M_dataplus._M_p != &local_128.field_2) {
            operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
          }
          std::operator+(&local_230,"\t\tfor j := ",&local_210);
          plVar7 = (long *)std::__cxx11::string::append((char *)&local_230);
          local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
          psVar10 = (size_type *)(plVar7 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar7 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar10) {
            local_250.field_2._M_allocated_capacity = *psVar10;
            local_250.field_2._8_8_ = plVar7[3];
          }
          else {
            local_250.field_2._M_allocated_capacity = *psVar10;
            local_250._M_dataplus._M_p = (pointer)*plVar7;
          }
          local_250._M_string_length = plVar7[1];
          *plVar7 = (long)psVar10;
          plVar7[1] = 0;
          *(undefined1 *)(plVar7 + 2) = 0;
          std::__cxx11::string::_M_append((char *)local_1d0,(ulong)local_250._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_250._M_dataplus._M_p != &local_250.field_2) {
            operator_delete(local_250._M_dataplus._M_p,local_250.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_230._M_dataplus._M_p != &local_230.field_2) {
            operator_delete(local_230._M_dataplus._M_p,local_230.field_2._M_allocated_capacity + 1);
          }
          BVar3 = (pFVar4->value).type.element;
          if (BVar3 - BASE_TYPE_UTYPE < 0xc) {
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_128,
                       *(char **)(GenTypeBasic[abi:cxx11](flatbuffers::Type_const&)::ctypename +
                                 (ulong)BVar3 * 8),(allocator<char> *)&local_108);
            (*(local_c0->namer_).super_Namer._vptr_Namer[0x14])
                      (&local_148,pIVar1,&local_128,
                       (ulong)(local_c0->namer_).super_Namer.config_.methods);
            puVar8 = (undefined8 *)
                     std::__cxx11::string::replace((ulong)&local_148,0,(char *)0x0,0x36bce9);
            local_188._M_dataplus._M_p = (pointer)&local_188.field_2;
            puVar11 = puVar8 + 2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar8 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)puVar11) {
              local_188.field_2._M_allocated_capacity = *puVar11;
              local_188.field_2._8_8_ = puVar8[3];
            }
            else {
              local_188.field_2._M_allocated_capacity = *puVar11;
              local_188._M_dataplus._M_p = (pointer)*puVar8;
            }
            local_188._M_string_length = puVar8[1];
            *puVar8 = puVar11;
            puVar8[1] = 0;
            *(undefined1 *)(puVar8 + 2) = 0;
            plVar7 = (long *)std::__cxx11::string::append((char *)&local_188);
            local_1a8 = &local_198;
            puVar11 = (ulong *)(plVar7 + 2);
            if ((ulong *)*plVar7 == puVar11) {
              local_198 = *puVar11;
              lStack_190 = plVar7[3];
            }
            else {
              local_198 = *puVar11;
              local_1a8 = (ulong *)*plVar7;
            }
            local_1a0 = plVar7[1];
            *plVar7 = (long)puVar11;
            plVar7[1] = 0;
            *(undefined1 *)(plVar7 + 2) = 0;
            local_50.base_type = (pFVar4->value).type.element;
            local_50.fixed_length = (pFVar4->value).type.fixed_length;
            local_50.element = BASE_TYPE_NONE;
            local_50.struct_def = (pFVar4->value).type.struct_def;
            local_50.enum_def = (pFVar4->value).type.enum_def;
            std::operator+(&local_70,"t.",&local_168);
            plVar7 = (long *)std::__cxx11::string::append((char *)&local_70);
            local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
            psVar10 = (size_type *)(plVar7 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar7 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar10) {
              local_b0.field_2._M_allocated_capacity = *psVar10;
              local_b0.field_2._8_8_ = plVar7[3];
            }
            else {
              local_b0.field_2._M_allocated_capacity = *psVar10;
              local_b0._M_dataplus._M_p = (pointer)*plVar7;
            }
            local_b0._M_string_length = plVar7[1];
            *plVar7 = (long)psVar10;
            plVar7[1] = 0;
            *(undefined1 *)(plVar7 + 2) = 0;
            CastToBaseType(&local_108,local_c0,&local_50,&local_b0);
            uVar14 = 0xf;
            if (local_1a8 != &local_198) {
              uVar14 = local_198;
            }
            if (uVar14 < local_108._M_string_length + local_1a0) {
              uVar13 = 0xf;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_108._M_dataplus._M_p != &local_108.field_2) {
                uVar13 = local_108.field_2._M_allocated_capacity;
              }
              if ((ulong)uVar13 < local_108._M_string_length + local_1a0) goto LAB_00204e58;
              puVar8 = (undefined8 *)
                       std::__cxx11::string::replace
                                 ((ulong)&local_108,0,(char *)0x0,(ulong)local_1a8);
            }
            else {
LAB_00204e58:
              puVar8 = (undefined8 *)
                       std::__cxx11::string::_M_append
                                 ((char *)&local_1a8,(ulong)local_108._M_dataplus._M_p);
            }
            local_230._M_dataplus._M_p = (pointer)&local_230.field_2;
            psVar10 = puVar8 + 2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar8 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar10) {
              local_230.field_2._M_allocated_capacity = *psVar10;
              local_230.field_2._8_8_ = puVar8[3];
            }
            else {
              local_230.field_2._M_allocated_capacity = *psVar10;
              local_230._M_dataplus._M_p = (pointer)*puVar8;
            }
            local_230._M_string_length = puVar8[1];
            *puVar8 = psVar10;
            puVar8[1] = 0;
            *(undefined1 *)psVar10 = 0;
            plVar7 = (long *)std::__cxx11::string::append((char *)&local_230);
            local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
            psVar10 = (size_type *)(plVar7 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar7 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar10) {
              local_250.field_2._M_allocated_capacity = *psVar10;
              local_250.field_2._8_8_ = plVar7[3];
            }
            else {
              local_250.field_2._M_allocated_capacity = *psVar10;
              local_250._M_dataplus._M_p = (pointer)*plVar7;
            }
            local_250._M_string_length = plVar7[1];
            *plVar7 = (long)psVar10;
            plVar7[1] = 0;
            *(undefined1 *)(plVar7 + 2) = 0;
            std::__cxx11::string::_M_append((char *)local_1d0,(ulong)local_250._M_dataplus._M_p);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_250._M_dataplus._M_p != &local_250.field_2) {
              operator_delete(local_250._M_dataplus._M_p,local_250.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_230._M_dataplus._M_p != &local_230.field_2) {
              operator_delete(local_230._M_dataplus._M_p,local_230.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_108._M_dataplus._M_p != &local_108.field_2) {
              operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
              operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_70._M_dataplus._M_p != &local_70.field_2) {
              operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
            }
            if (local_1a8 != &local_198) {
              operator_delete(local_1a8,local_198 + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_188._M_dataplus._M_p != &local_188.field_2) {
              operator_delete(local_188._M_dataplus._M_p,local_188.field_2._M_allocated_capacity + 1
                             );
            }
            if (local_148 != &local_138) {
              operator_delete(local_148,local_138 + 1);
            }
            uVar13 = local_128.field_2._M_allocated_capacity;
            _Var15._M_p = local_128._M_dataplus._M_p;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_128._M_dataplus._M_p != &local_128.field_2) {
LAB_00205102:
              operator_delete(_Var15._M_p,uVar13 + 1);
            }
          }
          else {
            if ((BVar3 == BASE_TYPE_STRUCT) && (((pFVar4->value).type.struct_def)->fixed == true)) {
              std::operator+(&local_230,"\t\t\tt.",&local_168);
              plVar7 = (long *)std::__cxx11::string::append((char *)&local_230);
              local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
              psVar10 = (size_type *)(plVar7 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar7 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)psVar10) {
                local_250.field_2._M_allocated_capacity = *psVar10;
                local_250.field_2._8_8_ = plVar7[3];
              }
              else {
                local_250.field_2._M_allocated_capacity = *psVar10;
                local_250._M_dataplus._M_p = (pointer)*plVar7;
              }
              local_250._M_string_length = plVar7[1];
              *plVar7 = (long)psVar10;
              plVar7[1] = 0;
              *(undefined1 *)(plVar7 + 2) = 0;
              std::__cxx11::string::_M_append((char *)local_1d0,(ulong)local_250._M_dataplus._M_p);
            }
            else {
              std::operator+(&local_230,"\t\t\tbuilder.PrependUOffsetT(",&local_1f0);
              plVar7 = (long *)std::__cxx11::string::append((char *)&local_230);
              local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
              psVar10 = (size_type *)(plVar7 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar7 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)psVar10) {
                local_250.field_2._M_allocated_capacity = *psVar10;
                local_250.field_2._8_8_ = plVar7[3];
              }
              else {
                local_250.field_2._M_allocated_capacity = *psVar10;
                local_250._M_dataplus._M_p = (pointer)*plVar7;
              }
              local_250._M_string_length = plVar7[1];
              *plVar7 = (long)psVar10;
              plVar7[1] = 0;
              *(undefined1 *)(plVar7 + 2) = 0;
              std::__cxx11::string::_M_append((char *)local_1d0,(ulong)local_250._M_dataplus._M_p);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_250._M_dataplus._M_p != &local_250.field_2) {
              operator_delete(local_250._M_dataplus._M_p,local_250.field_2._M_allocated_capacity + 1
                             );
            }
            uVar13 = local_230.field_2._M_allocated_capacity;
            _Var15._M_p = local_230._M_dataplus._M_p;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_230._M_dataplus._M_p != &local_230.field_2) goto LAB_00205102;
          }
          std::__cxx11::string::append((char *)local_1d0);
          std::operator+(&local_188,"\t\t",&local_e8);
          plVar7 = (long *)std::__cxx11::string::append((char *)&local_188);
          local_1a8 = &local_198;
          puVar11 = (ulong *)(plVar7 + 2);
          if ((ulong *)*plVar7 == puVar11) {
            local_198 = *puVar11;
            lStack_190 = plVar7[3];
          }
          else {
            local_198 = *puVar11;
            local_1a8 = (ulong *)*plVar7;
          }
          local_1a0 = plVar7[1];
          *plVar7 = (long)puVar11;
          plVar7[1] = 0;
          *(undefined1 *)(plVar7 + 2) = 0;
          puVar8 = (undefined8 *)
                   std::__cxx11::string::_M_append
                             ((char *)&local_1a8,(ulong)local_210._M_dataplus._M_p);
          local_230._M_dataplus._M_p = (pointer)&local_230.field_2;
          puVar11 = puVar8 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar8 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)puVar11) {
            local_230.field_2._M_allocated_capacity = *puVar11;
            local_230.field_2._8_8_ = puVar8[3];
          }
          else {
            local_230.field_2._M_allocated_capacity = *puVar11;
            local_230._M_dataplus._M_p = (pointer)*puVar8;
          }
          local_230._M_string_length = puVar8[1];
          *puVar8 = puVar11;
          puVar8[1] = 0;
          *(undefined1 *)(puVar8 + 2) = 0;
          puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_230);
          local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
          psVar10 = puVar8 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar8 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar10) {
            local_250.field_2._M_allocated_capacity = *psVar10;
            local_250.field_2._8_8_ = puVar8[3];
          }
          else {
            local_250.field_2._M_allocated_capacity = *psVar10;
            local_250._M_dataplus._M_p = (pointer)*puVar8;
          }
          local_250._M_string_length = puVar8[1];
          *puVar8 = psVar10;
          puVar8[1] = 0;
          *(undefined1 *)(puVar8 + 2) = 0;
          std::__cxx11::string::_M_append((char *)local_1d0,(ulong)local_250._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_250._M_dataplus._M_p != &local_250.field_2) {
            operator_delete(local_250._M_dataplus._M_p,local_250.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_230._M_dataplus._M_p != &local_230.field_2) {
            operator_delete(local_230._M_dataplus._M_p,local_230.field_2._M_allocated_capacity + 1);
          }
          if (local_1a8 != &local_198) {
            operator_delete(local_1a8,local_198 + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_188._M_dataplus._M_p != &local_188.field_2) {
            operator_delete(local_188._M_dataplus._M_p,local_188.field_2._M_allocated_capacity + 1);
          }
          std::__cxx11::string::append((char *)local_1d0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
            operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1);
          }
          uVar13 = local_210.field_2._M_allocated_capacity;
          _Var15._M_p = local_210._M_dataplus._M_p;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_210._M_dataplus._M_p == &local_210.field_2) break;
LAB_0020532d:
          operator_delete(_Var15._M_p,uVar13 + 1);
          break;
        case BASE_TYPE_STRUCT:
          if (((pFVar4->value).type.struct_def)->fixed == false) {
            std::operator+(&local_230,"\t",&local_e8);
            puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_230);
            local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
            psVar10 = puVar8 + 2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar8 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar10) {
              local_250.field_2._M_allocated_capacity = *psVar10;
              local_250.field_2._8_8_ = puVar8[3];
            }
            else {
              local_250.field_2._M_allocated_capacity = *psVar10;
              local_250._M_dataplus._M_p = (pointer)*puVar8;
            }
            local_250._M_string_length = puVar8[1];
            *puVar8 = psVar10;
            puVar8[1] = 0;
            *(undefined1 *)(puVar8 + 2) = 0;
            puVar8 = (undefined8 *)
                     std::__cxx11::string::_M_append
                               ((char *)&local_250,(ulong)local_168._M_dataplus._M_p);
            local_1f0._M_dataplus._M_p = (pointer)&local_1f0.field_2;
            psVar10 = puVar8 + 2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar8 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar10) {
              local_1f0.field_2._M_allocated_capacity = *psVar10;
              local_1f0.field_2._8_8_ = puVar8[3];
            }
            else {
              local_1f0.field_2._M_allocated_capacity = *psVar10;
              local_1f0._M_dataplus._M_p = (pointer)*puVar8;
            }
            local_1f0._M_string_length = puVar8[1];
            *puVar8 = psVar10;
            puVar8[1] = 0;
            *(undefined1 *)(puVar8 + 2) = 0;
            puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_1f0);
            local_210._M_dataplus._M_p = (pointer)&local_210.field_2;
            puVar11 = puVar8 + 2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar8 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)puVar11) {
              local_210.field_2._M_allocated_capacity = *puVar11;
              local_210.field_2._8_8_ = puVar8[3];
            }
            else {
              local_210.field_2._M_allocated_capacity = *puVar11;
              local_210._M_dataplus._M_p = (pointer)*puVar8;
            }
            local_210._M_string_length = puVar8[1];
            *puVar8 = puVar11;
            puVar8[1] = 0;
            *(undefined1 *)(puVar8 + 2) = 0;
            std::__cxx11::string::_M_append((char *)local_1d0,(ulong)local_210._M_dataplus._M_p);
            goto LAB_00203f54;
          }
          break;
        case BASE_TYPE_UNION:
          std::operator+(&local_230,"\t",&local_e8);
          plVar7 = (long *)std::__cxx11::string::append((char *)&local_230);
          local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
          psVar10 = (size_type *)(plVar7 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar7 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar10) {
            local_250.field_2._M_allocated_capacity = *psVar10;
            local_250.field_2._8_8_ = plVar7[3];
          }
          else {
            local_250.field_2._M_allocated_capacity = *psVar10;
            local_250._M_dataplus._M_p = (pointer)*plVar7;
          }
          local_250._M_string_length = plVar7[1];
          *plVar7 = (long)psVar10;
          plVar7[1] = 0;
          *(undefined1 *)(plVar7 + 2) = 0;
          plVar7 = (long *)std::__cxx11::string::_M_append
                                     ((char *)&local_250,(ulong)local_168._M_dataplus._M_p);
          local_1f0._M_dataplus._M_p = (pointer)&local_1f0.field_2;
          psVar10 = (size_type *)(plVar7 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar7 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar10) {
            local_1f0.field_2._M_allocated_capacity = *psVar10;
            local_1f0.field_2._8_8_ = plVar7[3];
          }
          else {
            local_1f0.field_2._M_allocated_capacity = *psVar10;
            local_1f0._M_dataplus._M_p = (pointer)*plVar7;
          }
          local_1f0._M_string_length = plVar7[1];
          *plVar7 = (long)psVar10;
          plVar7[1] = 0;
          *(undefined1 *)(plVar7 + 2) = 0;
          puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_1f0);
          local_210._M_dataplus._M_p = (pointer)&local_210.field_2;
          puVar11 = puVar8 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar8 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)puVar11) {
            local_210.field_2._M_allocated_capacity = *puVar11;
            local_210.field_2._8_8_ = puVar8[3];
          }
          else {
            local_210.field_2._M_allocated_capacity = *puVar11;
            local_210._M_dataplus._M_p = (pointer)*puVar8;
          }
          local_210._M_string_length = puVar8[1];
          *puVar8 = puVar11;
          puVar8[1] = 0;
          *(undefined1 *)(puVar8 + 2) = 0;
          std::__cxx11::string::_M_append((char *)local_1d0,(ulong)local_210._M_dataplus._M_p);
LAB_00203f54:
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_210._M_dataplus._M_p != &local_210.field_2) {
            operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
            operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_250._M_dataplus._M_p != &local_250.field_2) {
            operator_delete(local_250._M_dataplus._M_p,local_250.field_2._M_allocated_capacity + 1);
          }
          uVar13 = local_230.field_2._M_allocated_capacity;
          _Var15._M_p = local_230._M_dataplus._M_p;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_230._M_dataplus._M_p != &local_230.field_2) goto LAB_0020532d;
          break;
        default:
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/src/idl_gen_go.cpp"
                        ,0x496,
                        "void flatbuffers::go::GoGenerator::GenNativeTablePack(const StructDef &, std::string *)"
                       );
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
          operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
          operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_168._M_dataplus._M_p != &local_168.field_2) {
          operator_delete(local_168._M_dataplus._M_p,local_168.field_2._M_allocated_capacity + 1);
        }
      }
      ppFVar12 = ppFVar12 + 1;
    } while (ppFVar12 !=
             (local_c8->fields).vec.
             super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>.
             _M_impl.super__Vector_impl_data._M_finish);
  }
  std::operator+(&local_1c8,"\t",&local_90);
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_1c8);
  psVar10 = (size_type *)(plVar7 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar7 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar10) {
    local_168.field_2._M_allocated_capacity = *psVar10;
    local_168.field_2._8_8_ = plVar7[3];
    local_168._M_dataplus._M_p = (pointer)&local_168.field_2;
  }
  else {
    local_168.field_2._M_allocated_capacity = *psVar10;
    local_168._M_dataplus._M_p = (pointer)*plVar7;
  }
  local_168._M_string_length = plVar7[1];
  *plVar7 = (long)psVar10;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  std::__cxx11::string::_M_append((char *)local_1d0,(ulong)local_168._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_168._M_dataplus._M_p != &local_168.field_2) {
    operator_delete(local_168._M_dataplus._M_p,local_168.field_2._M_allocated_capacity + 1);
  }
  local_b8 = pIVar1;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
    operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
  }
  ppFVar12 = (local_c8->fields).vec.
             super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>.
             _M_impl.super__Vector_impl_data._M_start;
  ppFVar9 = (local_c8->fields).vec.
            super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  if (ppFVar12 != ppFVar9) {
    do {
      pIVar1 = local_b8;
      pFVar4 = *ppFVar12;
      if (pFVar4->deprecated == false) {
        (*(local_b8->super_Namer)._vptr_Namer[0x12])(&local_168,local_b8,pFVar4);
        (*(pIVar1->super_Namer)._vptr_Namer[6])(&local_1c8,pIVar1,pFVar4);
        (*(pIVar1->super_Namer)._vptr_Namer[7])(&local_210,pIVar1,pFVar4);
        paVar2 = &local_210.field_2;
        plVar7 = (long *)std::__cxx11::string::append((char *)&local_210);
        local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
        psVar10 = (size_type *)(plVar7 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar7 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar10) {
          local_e8.field_2._M_allocated_capacity = *psVar10;
          local_e8.field_2._8_8_ = plVar7[3];
        }
        else {
          local_e8.field_2._M_allocated_capacity = *psVar10;
          local_e8._M_dataplus._M_p = (pointer)*plVar7;
        }
        local_e8._M_string_length = plVar7[1];
        *plVar7 = (long)psVar10;
        plVar7[1] = 0;
        *(undefined1 *)(plVar7 + 2) = 0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_210._M_dataplus._M_p != paVar2) {
          operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
        }
        BVar3 = (pFVar4->value).type.base_type;
        if (BVar3 - BASE_TYPE_UTYPE < 0xc) {
          local_210._M_string_length = 0;
          local_210.field_2._M_allocated_capacity =
               local_210.field_2._M_allocated_capacity & 0xffffffffffffff00;
          local_210._M_dataplus._M_p = (pointer)paVar2;
          if (pFVar4->presence == kOptional) {
            std::operator+(&local_250,"\tif t.",&local_168);
            puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_250);
            local_1f0._M_dataplus._M_p = (pointer)&local_1f0.field_2;
            psVar10 = puVar8 + 2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar8 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar10) {
              local_1f0.field_2._M_allocated_capacity = *psVar10;
              local_1f0.field_2._8_8_ = puVar8[3];
            }
            else {
              local_1f0.field_2._M_allocated_capacity = *psVar10;
              local_1f0._M_dataplus._M_p = (pointer)*puVar8;
            }
            local_1f0._M_string_length = puVar8[1];
            *puVar8 = psVar10;
            puVar8[1] = 0;
            *(undefined1 *)(puVar8 + 2) = 0;
            std::__cxx11::string::_M_append((char *)local_1d0,(ulong)local_1f0._M_dataplus._M_p);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
              operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_250._M_dataplus._M_p != &local_250.field_2) {
              operator_delete(local_250._M_dataplus._M_p,local_250.field_2._M_allocated_capacity + 1
                             );
            }
            std::__cxx11::string::_M_replace
                      ((ulong)&local_210,0,(char *)local_210._M_string_length,0x36bef4);
          }
          pEVar5 = (pFVar4->value).type.enum_def;
          if ((pEVar5 == (EnumDef *)0x0) || (pEVar5->is_union == false)) {
            std::operator+(&local_108,"\t",&local_90);
            puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_108);
            local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
            psVar10 = puVar8 + 2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar8 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar10) {
              local_128.field_2._M_allocated_capacity = *psVar10;
              local_128.field_2._8_8_ = puVar8[3];
            }
            else {
              local_128.field_2._M_allocated_capacity = *psVar10;
              local_128._M_dataplus._M_p = (pointer)*puVar8;
            }
            local_128._M_string_length = puVar8[1];
            *puVar8 = psVar10;
            puVar8[1] = 0;
            *(undefined1 *)(puVar8 + 2) = 0;
            plVar7 = (long *)std::__cxx11::string::_M_append
                                       ((char *)&local_128,(ulong)local_1c8._M_dataplus._M_p);
            local_148 = &local_138;
            puVar11 = (ulong *)(plVar7 + 2);
            if ((ulong *)*plVar7 == puVar11) {
              local_138 = *puVar11;
              lStack_130 = plVar7[3];
            }
            else {
              local_138 = *puVar11;
              local_148 = (ulong *)*plVar7;
            }
            local_140 = plVar7[1];
            *plVar7 = (long)puVar11;
            plVar7[1] = 0;
            *(undefined1 *)(plVar7 + 2) = 0;
            puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_148);
            local_188._M_dataplus._M_p = (pointer)&local_188.field_2;
            puVar11 = puVar8 + 2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar8 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)puVar11) {
              local_188.field_2._M_allocated_capacity = *puVar11;
              local_188.field_2._8_8_ = puVar8[3];
            }
            else {
              local_188.field_2._M_allocated_capacity = *puVar11;
              local_188._M_dataplus._M_p = (pointer)*puVar8;
            }
            local_188._M_string_length = puVar8[1];
            *puVar8 = puVar11;
            puVar8[1] = 0;
            *(undefined1 *)(puVar8 + 2) = 0;
            plVar7 = (long *)std::__cxx11::string::_M_append
                                       ((char *)&local_188,(ulong)local_210._M_dataplus._M_p);
            local_1a8 = &local_198;
            puVar11 = (ulong *)(plVar7 + 2);
            if ((ulong *)*plVar7 == puVar11) {
              local_198 = *puVar11;
              lStack_190 = plVar7[3];
            }
            else {
              local_198 = *puVar11;
              local_1a8 = (ulong *)*plVar7;
            }
            local_1a0 = plVar7[1];
            *plVar7 = (long)puVar11;
            plVar7[1] = 0;
            *(undefined1 *)(plVar7 + 2) = 0;
            puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_1a8);
            local_230._M_dataplus._M_p = (pointer)&local_230.field_2;
            puVar11 = puVar8 + 2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar8 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)puVar11) {
              local_230.field_2._M_allocated_capacity = *puVar11;
              local_230.field_2._8_8_ = puVar8[3];
            }
            else {
              local_230.field_2._M_allocated_capacity = *puVar11;
              local_230._M_dataplus._M_p = (pointer)*puVar8;
            }
            local_230._M_string_length = puVar8[1];
            *puVar8 = puVar11;
            puVar8[1] = 0;
            *(undefined1 *)(puVar8 + 2) = 0;
            puVar8 = (undefined8 *)
                     std::__cxx11::string::_M_append
                               ((char *)&local_230,(ulong)local_168._M_dataplus._M_p);
            local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
            psVar10 = puVar8 + 2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar8 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar10) {
              local_250.field_2._M_allocated_capacity = *psVar10;
              local_250.field_2._8_8_ = puVar8[3];
            }
            else {
              local_250.field_2._M_allocated_capacity = *psVar10;
              local_250._M_dataplus._M_p = (pointer)*puVar8;
            }
            local_250._M_string_length = puVar8[1];
            *puVar8 = psVar10;
            puVar8[1] = 0;
            *(undefined1 *)(puVar8 + 2) = 0;
            puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_250);
            local_1f0._M_dataplus._M_p = (pointer)&local_1f0.field_2;
            psVar10 = puVar8 + 2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar8 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar10) {
              local_1f0.field_2._M_allocated_capacity = *psVar10;
              local_1f0.field_2._8_8_ = puVar8[3];
            }
            else {
              local_1f0.field_2._M_allocated_capacity = *psVar10;
              local_1f0._M_dataplus._M_p = (pointer)*puVar8;
            }
            local_1f0._M_string_length = puVar8[1];
            *puVar8 = psVar10;
            puVar8[1] = 0;
            *(undefined1 *)(puVar8 + 2) = 0;
            std::__cxx11::string::_M_append((char *)local_1d0,(ulong)local_1f0._M_dataplus._M_p);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
              operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_250._M_dataplus._M_p != &local_250.field_2) {
              operator_delete(local_250._M_dataplus._M_p,local_250.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_230._M_dataplus._M_p != &local_230.field_2) {
              operator_delete(local_230._M_dataplus._M_p,local_230.field_2._M_allocated_capacity + 1
                             );
            }
            if (local_1a8 != &local_198) {
              operator_delete(local_1a8,local_198 + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_188._M_dataplus._M_p != &local_188.field_2) {
              operator_delete(local_188._M_dataplus._M_p,local_188.field_2._M_allocated_capacity + 1
                             );
            }
            if (local_148 != &local_138) {
              operator_delete(local_148,local_138 + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_128._M_dataplus._M_p != &local_128.field_2) {
              operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_108._M_dataplus._M_p != &local_108.field_2) {
              operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1
                             );
            }
          }
          if (((pFVar4->value).type.base_type - BASE_TYPE_UTYPE < 0xc) &&
             (pFVar4->presence == kOptional)) {
            std::__cxx11::string::append((char *)local_1d0);
          }
          uVar13 = local_210.field_2._M_allocated_capacity;
          _Var15._M_p = local_210._M_dataplus._M_p;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_210._M_dataplus._M_p != paVar2) {
LAB_00206459:
            operator_delete(_Var15._M_p,uVar13 + 1);
          }
        }
        else {
          if ((BVar3 == BASE_TYPE_STRUCT) && (((pFVar4->value).type.struct_def)->fixed == true)) {
            std::operator+(&local_230,"\t",&local_e8);
            puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_230);
            local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
            psVar10 = puVar8 + 2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar8 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar10) {
              local_250.field_2._M_allocated_capacity = *psVar10;
              local_250.field_2._8_8_ = puVar8[3];
            }
            else {
              local_250.field_2._M_allocated_capacity = *psVar10;
              local_250._M_dataplus._M_p = (pointer)*puVar8;
            }
            local_250._M_string_length = puVar8[1];
            *puVar8 = psVar10;
            puVar8[1] = 0;
            *(undefined1 *)(puVar8 + 2) = 0;
            puVar8 = (undefined8 *)
                     std::__cxx11::string::_M_append
                               ((char *)&local_250,(ulong)local_168._M_dataplus._M_p);
            local_1f0._M_dataplus._M_p = (pointer)&local_1f0.field_2;
            psVar10 = puVar8 + 2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar8 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar10) {
              local_1f0.field_2._M_allocated_capacity = *psVar10;
              local_1f0.field_2._8_8_ = puVar8[3];
            }
            else {
              local_1f0.field_2._M_allocated_capacity = *psVar10;
              local_1f0._M_dataplus._M_p = (pointer)*puVar8;
            }
            local_1f0._M_string_length = puVar8[1];
            *puVar8 = psVar10;
            puVar8[1] = 0;
            *(undefined1 *)(puVar8 + 2) = 0;
            puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_1f0);
            puVar11 = puVar8 + 2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar8 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)puVar11) {
              local_210.field_2._M_allocated_capacity = *puVar11;
              local_210.field_2._8_8_ = puVar8[3];
              local_210._M_dataplus._M_p = (pointer)paVar2;
            }
            else {
              local_210.field_2._M_allocated_capacity = *puVar11;
              local_210._M_dataplus._M_p = (pointer)*puVar8;
            }
            local_210._M_string_length = puVar8[1];
            *puVar8 = puVar11;
            puVar8[1] = 0;
            *(undefined1 *)(puVar8 + 2) = 0;
            std::__cxx11::string::_M_append((char *)local_1d0,(ulong)local_210._M_dataplus._M_p);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_210._M_dataplus._M_p != paVar2) {
              operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
              operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_250._M_dataplus._M_p != &local_250.field_2) {
              operator_delete(local_250._M_dataplus._M_p,local_250.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_230._M_dataplus._M_p != &local_230.field_2) {
              operator_delete(local_230._M_dataplus._M_p,local_230.field_2._M_allocated_capacity + 1
                             );
            }
          }
          else {
            pEVar5 = (pFVar4->value).type.enum_def;
            if ((pEVar5 != (EnumDef *)0x0) && (pEVar5->is_union == true)) {
              std::operator+(&local_1f0,"\tif t.",&local_168);
              plVar7 = (long *)std::__cxx11::string::append((char *)&local_1f0);
              psVar10 = (size_type *)(plVar7 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar7 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)psVar10) {
                local_210.field_2._M_allocated_capacity = *psVar10;
                local_210.field_2._8_8_ = plVar7[3];
                local_210._M_dataplus._M_p = (pointer)paVar2;
              }
              else {
                local_210.field_2._M_allocated_capacity = *psVar10;
                local_210._M_dataplus._M_p = (pointer)*plVar7;
              }
              local_210._M_string_length = plVar7[1];
              *plVar7 = (long)psVar10;
              plVar7[1] = 0;
              *(undefined1 *)(plVar7 + 2) = 0;
              std::__cxx11::string::_M_append((char *)local_1d0,(ulong)local_210._M_dataplus._M_p);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_210._M_dataplus._M_p != paVar2) {
                operator_delete(local_210._M_dataplus._M_p,
                                local_210.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
                operator_delete(local_1f0._M_dataplus._M_p,
                                local_1f0.field_2._M_allocated_capacity + 1);
              }
              std::operator+(&local_188,"\t\t",&local_90);
              plVar7 = (long *)std::__cxx11::string::append((char *)&local_188);
              local_1a8 = &local_198;
              puVar11 = (ulong *)(plVar7 + 2);
              if ((ulong *)*plVar7 == puVar11) {
                local_198 = *puVar11;
                lStack_190 = plVar7[3];
              }
              else {
                local_198 = *puVar11;
                local_1a8 = (ulong *)*plVar7;
              }
              local_1a0 = plVar7[1];
              *plVar7 = (long)puVar11;
              plVar7[1] = 0;
              *(undefined1 *)(plVar7 + 2) = 0;
              local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
              pcVar6 = (pFVar4->super_Definition).name._M_dataplus._M_p;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_128,pcVar6,
                         pcVar6 + (pFVar4->super_Definition).name._M_string_length);
              std::__cxx11::string::append((char *)&local_128);
              (*(local_c0->namer_).super_Namer._vptr_Namer[0x14])
                        (&local_148,local_b8,&local_128,
                         (ulong)(local_c0->namer_).super_Namer.config_.methods);
              uVar14 = 0xf;
              if (local_1a8 != &local_198) {
                uVar14 = local_198;
              }
              if (uVar14 < (ulong)(local_140 + local_1a0)) {
                uVar14 = 0xf;
                if (local_148 != &local_138) {
                  uVar14 = local_138;
                }
                if (uVar14 < (ulong)(local_140 + local_1a0)) goto LAB_00205f0d;
                puVar8 = (undefined8 *)
                         std::__cxx11::string::replace
                                   ((ulong)&local_148,0,(char *)0x0,(ulong)local_1a8);
              }
              else {
LAB_00205f0d:
                puVar8 = (undefined8 *)
                         std::__cxx11::string::_M_append((char *)&local_1a8,(ulong)local_148);
              }
              local_230._M_dataplus._M_p = (pointer)&local_230.field_2;
              puVar11 = puVar8 + 2;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*puVar8 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)puVar11) {
                local_230.field_2._M_allocated_capacity = *puVar11;
                local_230.field_2._8_8_ = puVar8[3];
              }
              else {
                local_230.field_2._M_allocated_capacity = *puVar11;
                local_230._M_dataplus._M_p = (pointer)*puVar8;
              }
              local_230._M_string_length = puVar8[1];
              *puVar8 = puVar11;
              puVar8[1] = 0;
              *(undefined1 *)puVar11 = 0;
              puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_230);
              local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
              psVar10 = puVar8 + 2;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*puVar8 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)psVar10) {
                local_250.field_2._M_allocated_capacity = *psVar10;
                local_250.field_2._8_8_ = puVar8[3];
              }
              else {
                local_250.field_2._M_allocated_capacity = *psVar10;
                local_250._M_dataplus._M_p = (pointer)*puVar8;
              }
              local_250._M_string_length = puVar8[1];
              *puVar8 = psVar10;
              puVar8[1] = 0;
              *(undefined1 *)(puVar8 + 2) = 0;
              puVar8 = (undefined8 *)
                       std::__cxx11::string::_M_append
                                 ((char *)&local_250,(ulong)local_168._M_dataplus._M_p);
              local_1f0._M_dataplus._M_p = (pointer)&local_1f0.field_2;
              psVar10 = puVar8 + 2;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*puVar8 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)psVar10) {
                local_1f0.field_2._M_allocated_capacity = *psVar10;
                local_1f0.field_2._8_8_ = puVar8[3];
              }
              else {
                local_1f0.field_2._M_allocated_capacity = *psVar10;
                local_1f0._M_dataplus._M_p = (pointer)*puVar8;
              }
              local_1f0._M_string_length = puVar8[1];
              *puVar8 = psVar10;
              puVar8[1] = 0;
              *(undefined1 *)(puVar8 + 2) = 0;
              puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_1f0);
              puVar11 = puVar8 + 2;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*puVar8 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)puVar11) {
                local_210.field_2._M_allocated_capacity = *puVar11;
                local_210.field_2._8_8_ = puVar8[3];
                local_210._M_dataplus._M_p = (pointer)paVar2;
              }
              else {
                local_210.field_2._M_allocated_capacity = *puVar11;
                local_210._M_dataplus._M_p = (pointer)*puVar8;
              }
              local_210._M_string_length = puVar8[1];
              *puVar8 = puVar11;
              puVar8[1] = 0;
              *(undefined1 *)(puVar8 + 2) = 0;
              std::__cxx11::string::_M_append((char *)local_1d0,(ulong)local_210._M_dataplus._M_p);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_210._M_dataplus._M_p != paVar2) {
                operator_delete(local_210._M_dataplus._M_p,
                                local_210.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
                operator_delete(local_1f0._M_dataplus._M_p,
                                local_1f0.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_250._M_dataplus._M_p != &local_250.field_2) {
                operator_delete(local_250._M_dataplus._M_p,
                                local_250.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_230._M_dataplus._M_p != &local_230.field_2) {
                operator_delete(local_230._M_dataplus._M_p,
                                local_230.field_2._M_allocated_capacity + 1);
              }
              if (local_148 != &local_138) {
                operator_delete(local_148,local_138 + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_128._M_dataplus._M_p != &local_128.field_2) {
                operator_delete(local_128._M_dataplus._M_p,
                                local_128.field_2._M_allocated_capacity + 1);
              }
              if (local_1a8 != &local_198) {
                operator_delete(local_1a8,local_198 + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_188._M_dataplus._M_p != &local_188.field_2) {
                operator_delete(local_188._M_dataplus._M_p,
                                local_188.field_2._M_allocated_capacity + 1);
              }
              std::__cxx11::string::append((char *)local_1d0);
            }
          }
          std::operator+(&local_188,"\t",&local_90);
          plVar7 = (long *)std::__cxx11::string::append((char *)&local_188);
          local_1a8 = &local_198;
          puVar11 = (ulong *)(plVar7 + 2);
          if ((ulong *)*plVar7 == puVar11) {
            local_198 = *puVar11;
            lStack_190 = plVar7[3];
          }
          else {
            local_198 = *puVar11;
            local_1a8 = (ulong *)*plVar7;
          }
          local_1a0 = plVar7[1];
          *plVar7 = (long)puVar11;
          plVar7[1] = 0;
          *(undefined1 *)(plVar7 + 2) = 0;
          puVar8 = (undefined8 *)
                   std::__cxx11::string::_M_append
                             ((char *)&local_1a8,(ulong)local_1c8._M_dataplus._M_p);
          local_230._M_dataplus._M_p = (pointer)&local_230.field_2;
          puVar11 = puVar8 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar8 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)puVar11) {
            local_230.field_2._M_allocated_capacity = *puVar11;
            local_230.field_2._8_8_ = puVar8[3];
          }
          else {
            local_230.field_2._M_allocated_capacity = *puVar11;
            local_230._M_dataplus._M_p = (pointer)*puVar8;
          }
          local_230._M_string_length = puVar8[1];
          *puVar8 = puVar11;
          puVar8[1] = 0;
          *(undefined1 *)(puVar8 + 2) = 0;
          puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_230);
          local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
          psVar10 = puVar8 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar8 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar10) {
            local_250.field_2._M_allocated_capacity = *psVar10;
            local_250.field_2._8_8_ = puVar8[3];
          }
          else {
            local_250.field_2._M_allocated_capacity = *psVar10;
            local_250._M_dataplus._M_p = (pointer)*puVar8;
          }
          local_250._M_string_length = puVar8[1];
          *puVar8 = psVar10;
          puVar8[1] = 0;
          *(undefined1 *)(puVar8 + 2) = 0;
          puVar8 = (undefined8 *)
                   std::__cxx11::string::_M_append
                             ((char *)&local_250,(ulong)local_e8._M_dataplus._M_p);
          local_1f0._M_dataplus._M_p = (pointer)&local_1f0.field_2;
          psVar10 = puVar8 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar8 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar10) {
            local_1f0.field_2._M_allocated_capacity = *psVar10;
            local_1f0.field_2._8_8_ = puVar8[3];
          }
          else {
            local_1f0.field_2._M_allocated_capacity = *psVar10;
            local_1f0._M_dataplus._M_p = (pointer)*puVar8;
          }
          local_1f0._M_string_length = puVar8[1];
          *puVar8 = psVar10;
          puVar8[1] = 0;
          *(undefined1 *)(puVar8 + 2) = 0;
          puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_1f0);
          puVar11 = puVar8 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar8 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)puVar11) {
            local_210.field_2._M_allocated_capacity = *puVar11;
            local_210.field_2._8_8_ = puVar8[3];
            local_210._M_dataplus._M_p = (pointer)paVar2;
          }
          else {
            local_210.field_2._M_allocated_capacity = *puVar11;
            local_210._M_dataplus._M_p = (pointer)*puVar8;
          }
          local_210._M_string_length = puVar8[1];
          *puVar8 = puVar11;
          puVar8[1] = 0;
          *(undefined1 *)(puVar8 + 2) = 0;
          std::__cxx11::string::_M_append((char *)local_1d0,(ulong)local_210._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_210._M_dataplus._M_p != paVar2) {
            operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
            operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_250._M_dataplus._M_p != &local_250.field_2) {
            operator_delete(local_250._M_dataplus._M_p,local_250.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_230._M_dataplus._M_p != &local_230.field_2) {
            operator_delete(local_230._M_dataplus._M_p,local_230.field_2._M_allocated_capacity + 1);
          }
          if (local_1a8 != &local_198) {
            operator_delete(local_1a8,local_198 + 1);
          }
          uVar13 = local_188.field_2._M_allocated_capacity;
          _Var15._M_p = local_188._M_dataplus._M_p;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_188._M_dataplus._M_p != &local_188.field_2) goto LAB_00206459;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
          operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
          operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_168._M_dataplus._M_p != &local_168.field_2) {
          operator_delete(local_168._M_dataplus._M_p,local_168.field_2._M_allocated_capacity + 1);
        }
        ppFVar9 = (local_c8->fields).vec.
                  super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      }
      ppFVar12 = ppFVar12 + 1;
    } while (ppFVar12 != ppFVar9);
  }
  std::operator+(&local_1c8,"\treturn ",&local_90);
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_1c8);
  psVar10 = (size_type *)(plVar7 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar7 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar10) {
    local_168.field_2._M_allocated_capacity = *psVar10;
    local_168.field_2._8_8_ = plVar7[3];
    local_168._M_dataplus._M_p = (pointer)&local_168.field_2;
  }
  else {
    local_168.field_2._M_allocated_capacity = *psVar10;
    local_168._M_dataplus._M_p = (pointer)*plVar7;
  }
  local_168._M_string_length = plVar7[1];
  *plVar7 = (long)psVar10;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  std::__cxx11::string::_M_append((char *)local_1d0,(ulong)local_168._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_168._M_dataplus._M_p != &local_168.field_2) {
    operator_delete(local_168._M_dataplus._M_p,local_168.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
    operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::string::append((char *)local_1d0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void GenNativeTablePack(const StructDef &struct_def, std::string *code_ptr) {
    std::string &code = *code_ptr;
    const std::string struct_type = namer_.Type(struct_def);

    code += "func (t *" + NativeName(struct_def) +
            ") Pack(builder *flatbuffers.Builder) flatbuffers.UOffsetT {\n";
    code += "\tif t == nil {\n\t\treturn 0\n\t}\n";
    for (auto it = struct_def.fields.vec.begin();
         it != struct_def.fields.vec.end(); ++it) {
      const FieldDef &field = **it;
      if (field.deprecated) continue;
      if (IsScalar(field.value.type.base_type)) continue;

      const std::string field_field = namer_.Field(field);
      const std::string field_var = namer_.Variable(field);
      const std::string offset = field_var + "Offset";

      if (IsString(field.value.type)) {
        code += "\t" + offset + " := flatbuffers.UOffsetT(0)\n";
        code += "\tif t." + field_field + " != \"\" {\n";
        code += "\t\t" + offset + " = builder.CreateString(t." + field_field +
                ")\n";
        code += "\t}\n";
      } else if (IsVector(field.value.type) &&
                 field.value.type.element == BASE_TYPE_UCHAR &&
                 field.value.type.enum_def == nullptr) {
        code += "\t" + offset + " := flatbuffers.UOffsetT(0)\n";
        code += "\tif t." + field_field + " != nil {\n";
        code += "\t\t" + offset + " = builder.CreateByteString(t." +
                field_field + ")\n";
        code += "\t}\n";
      } else if (IsVector(field.value.type)) {
        code += "\t" + offset + " := flatbuffers.UOffsetT(0)\n";
        code += "\tif t." + field_field + " != nil {\n";
        std::string length = field_var + "Length";
        std::string offsets = field_var + "Offsets";
        code += "\t\t" + length + " := len(t." + field_field + ")\n";
        if (field.value.type.element == BASE_TYPE_STRING) {
          code += "\t\t" + offsets + " := make([]flatbuffers.UOffsetT, " +
                  length + ")\n";
          code += "\t\tfor j := 0; j < " + length + "; j++ {\n";
          code += "\t\t\t" + offsets + "[j] = builder.CreateString(t." +
                  field_field + "[j])\n";
          code += "\t\t}\n";
        } else if (field.value.type.element == BASE_TYPE_STRUCT &&
                   !field.value.type.struct_def->fixed) {
          code += "\t\t" + offsets + " := make([]flatbuffers.UOffsetT, " +
                  length + ")\n";
          code += "\t\tfor j := 0; j < " + length + "; j++ {\n";
          code += "\t\t\t" + offsets + "[j] = t." + field_field +
                  "[j].Pack(builder)\n";
          code += "\t\t}\n";
        }
        code += "\t\t" + struct_type + "Start" + namer_.Function(field) +
                "Vector(builder, " + length + ")\n";
        code += "\t\tfor j := " + length + " - 1; j >= 0; j-- {\n";
        if (IsScalar(field.value.type.element)) {
          code += "\t\t\tbuilder.Prepend" +
                  namer_.Method(GenTypeBasic(field.value.type.VectorType())) +
                  "(" +
                  CastToBaseType(field.value.type.VectorType(),
                                 "t." + field_field + "[j]") +
                  ")\n";
        } else if (field.value.type.element == BASE_TYPE_STRUCT &&
                   field.value.type.struct_def->fixed) {
          code += "\t\t\tt." + field_field + "[j].Pack(builder)\n";
        } else {
          code += "\t\t\tbuilder.PrependUOffsetT(" + offsets + "[j])\n";
        }
        code += "\t\t}\n";
        code += "\t\t" + offset + " = builder.EndVector(" + length + ")\n";
        code += "\t}\n";
      } else if (field.value.type.base_type == BASE_TYPE_STRUCT) {
        if (field.value.type.struct_def->fixed) continue;
        code += "\t" + offset + " := t." + field_field + ".Pack(builder)\n";
      } else if (field.value.type.base_type == BASE_TYPE_UNION) {
        code += "\t" + offset + " := t." + field_field + ".Pack(builder)\n\n";
      } else {
        FLATBUFFERS_ASSERT(0);
      }
    }
    code += "\t" + struct_type + "Start(builder)\n";
    for (auto it = struct_def.fields.vec.begin();
         it != struct_def.fields.vec.end(); ++it) {
      const FieldDef &field = **it;
      if (field.deprecated) continue;
      const std::string field_field = namer_.Field(field);
      const std::string field_fn = namer_.Function(field);
      const std::string offset = namer_.Variable(field) + "Offset";

      if (IsScalar(field.value.type.base_type)) {
        std::string prefix;
        if (field.IsScalarOptional()) {
          code += "\tif t." + field_field + " != nil {\n\t";
          prefix = "*";
        }
        if (field.value.type.enum_def == nullptr ||
            !field.value.type.enum_def->is_union) {
          code += "\t" + struct_type + "Add" + field_fn + "(builder, " +
                  prefix + "t." + field_field + ")\n";
        }
        if (field.IsScalarOptional()) { code += "\t}\n"; }
      } else {
        if (field.value.type.base_type == BASE_TYPE_STRUCT &&
            field.value.type.struct_def->fixed) {
          code += "\t" + offset + " := t." + field_field + ".Pack(builder)\n";
        } else if (field.value.type.enum_def != nullptr &&
                   field.value.type.enum_def->is_union) {
          code += "\tif t." + field_field + " != nil {\n";
          code += "\t\t" + struct_type + "Add" +
                  namer_.Method(field.name + UnionTypeFieldSuffix()) +
                  "(builder, t." + field_field + ".Type)\n";
          code += "\t}\n";
        }
        code += "\t" + struct_type + "Add" + field_fn + "(builder, " + offset +
                ")\n";
      }
    }
    code += "\treturn " + struct_type + "End(builder)\n";
    code += "}\n\n";
  }